

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O2

bool __thiscall
IRT::MemFromConstPlusRegPattern::TryToGenerateCode
          (MemFromConstPlusRegPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  CMemExpression *this_00;
  CExpression *pCVar1;
  CBinopExpression *this_01;
  CConstExpression *this_02;
  CTempExpression *this_03;
  CTemp *__args_2;
  CTemp source;
  pair<IRT::CTemp,_const_IRT::INode_*> local_a0;
  CTemp local_78;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_58;
  
  if (tree != (INode *)0x0) {
    this_00 = (CMemExpression *)__dynamic_cast(tree,&INode::typeinfo,&CMemExpression::typeinfo,0);
    if (this_00 == (CMemExpression *)0x0) {
      return false;
    }
    pCVar1 = CMemExpression::getAddress(this_00);
    if (pCVar1 != (CExpression *)0x0) {
      this_01 = (CBinopExpression *)
                __dynamic_cast(pCVar1,&CExpression::typeinfo,&CBinopExpression::typeinfo,0);
      if (this_01 == (CBinopExpression *)0x0) {
        return false;
      }
      pCVar1 = CBinopExpression::getLeftOperand(this_01);
      if (pCVar1 != (CExpression *)0x0) {
        this_02 = (CConstExpression *)
                  __dynamic_cast(pCVar1,&CExpression::typeinfo,&CConstExpression::typeinfo,0);
        if (this_02 != (CConstExpression *)0x0) {
          pCVar1 = CBinopExpression::getRightOperand(this_01);
          if ((pCVar1 == (CExpression *)0x0) ||
             (this_03 = (CTempExpression *)
                        __dynamic_cast(pCVar1,&CExpression::typeinfo,&CTempExpression::typeinfo,0),
             this_03 == (CTempExpression *)0x0)) {
            CTemp::CTemp(&local_78);
            pCVar1 = CMemExpression::getAddress(this_00);
            std::__cxx11::string::string((string *)&local_58,(string *)&local_78);
            local_58.second = pCVar1;
            std::pair<IRT::CTemp,_const_IRT::INode_*>::
            pair<IRT::CTemp,_const_IRT::CExpression_*,_true>(&local_a0,&local_58);
            std::
            vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
            ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                      ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                        *)children,&local_a0);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_58);
            local_58.first.name._M_dataplus._M_p._0_4_ = CConstExpression::getValue(this_02);
            std::
            make_shared<AssemblyCode::MoveMemFromRegPlusConstToReg,IRT::CTemp_const&,IRT::CTemp&,int>
                      (&local_a0.first,dest,(int *)&local_78);
            std::
            vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
            ::emplace_back<std::shared_ptr<AssemblyCode::MoveMemFromRegPlusConstToReg>>
                      ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                        *)commands,
                       (shared_ptr<AssemblyCode::MoveMemFromRegPlusConstToReg> *)&local_a0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_a0.first.name._M_string_length);
            std::__cxx11::string::~string((string *)&local_78);
          }
          else {
            __args_2 = CTempExpression::getTemprorary(this_03);
            local_58.first.name._M_dataplus._M_p._0_4_ = CConstExpression::getValue(this_02);
            std::
            make_shared<AssemblyCode::MoveMemFromRegPlusConstToReg,IRT::CTemp_const&,IRT::CTemp_const&,int>
                      (&local_a0.first,dest,(int *)__args_2);
            std::
            vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
            ::emplace_back<std::shared_ptr<AssemblyCode::MoveMemFromRegPlusConstToReg>>
                      ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                        *)commands,
                       (shared_ptr<AssemblyCode::MoveMemFromRegPlusConstToReg> *)&local_a0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_a0.first.name._M_string_length);
          }
          return true;
        }
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool IRT::MemFromConstPlusRegPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest,
                                                         ChildrenTemps &children, AssemblyCommands &commands ) {
    ConstMemPtr memPtr = dynamic_cast<ConstMemPtr>(tree);
    if ( memPtr ) {
        ConstBinopPtr constBinopPtr = dynamic_cast<ConstBinopPtr>(memPtr->getAddress( ));
        if ( constBinopPtr ) {
            ConstConstPtr constPtr = dynamic_cast<ConstConstPtr>(constBinopPtr->getLeftOperand( ));
            if ( constPtr ) {
                ConstTempPtr constTempPtr = dynamic_cast<ConstTempPtr>(constBinopPtr->getRightOperand( ));
                if ( constTempPtr ) {
                    commands.emplace_back(
                            std::make_shared<AssemblyCode::MoveMemFromRegPlusConstToReg>( dest,
                                                                                          constTempPtr->getTemprorary( ),
                                                                                          constPtr->getValue( )));
                } else {
                    CTemp source;
                    children.push_back( std::make_pair( source, memPtr->getAddress( )));
                    commands.emplace_back(
                            std::make_shared<AssemblyCode::MoveMemFromRegPlusConstToReg>( dest, source,
                                                                                          constPtr->getValue( )));
                }
                return true;
            }
        }
    }
    return false;
}